

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O0

void __thiscall ImGuiWS::Impl::Events::push(Events *this,Event *event)

{
  deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *in_RDI;
  lock_guard<std::mutex> lock;
  value_type *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffffc8);
  std::deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>::push_back
            (in_RDI,in_stack_ffffffffffffffc8);
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1daa2f);
  return;
}

Assistant:

void push(Event && event) {
            std::lock_guard<std::mutex> lock(mutex);
            data.push_back(std::move(event));
            cv.notify_one();
        }